

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

bool __thiscall
pybind11::detail::type_caster_generic::try_load_foreign_module_local
          (type_caster_generic *this,handle src)

{
  _func_void_ptr_PyObject_ptr_type_info_ptr *p_Var1;
  bool bVar2;
  type_info *ptVar3;
  PyObject **ppPVar4;
  void *pvVar5;
  void *result;
  handle local_60;
  PyObject *local_58;
  capsule local_50;
  type_info *local_48;
  type_info *foreign_typeinfo;
  PyObject *local_38;
  handle local_30;
  handle pytype;
  char *local_key;
  type_caster_generic *this_local;
  handle src_local;
  
  pytype.m_ptr = (PyObject *)anon_var_dwarf_9069e;
  local_38 = src.m_ptr;
  this_local = (type_caster_generic *)src.m_ptr;
  foreign_typeinfo = (type_info *)pybind11::type::handle_of(src);
  local_30 = (handle)foreign_typeinfo;
  bVar2 = hasattr((handle)foreign_typeinfo,"__pybind11_module_local_v4_clang_libstdcpp_cxxabi1002__"
                 );
  if (bVar2) {
    getattr((pybind11 *)&local_60,local_30,"__pybind11_module_local_v4_clang_libstdcpp_cxxabi1002__"
           );
    local_58 = local_60.m_ptr;
    reinterpret_borrow<pybind11::capsule>((pybind11 *)&local_50,local_60);
    ptVar3 = capsule::operator_cast_to_type_info_(&local_50);
    capsule::~capsule(&local_50);
    object::~object((object *)&local_60);
    if ((ptVar3->module_local_load == local_load) ||
       ((local_48 = ptVar3, this->cpptype != (type_info *)0x0 &&
        (bVar2 = same_type(this->cpptype,ptVar3->cpptype), !bVar2)))) {
      src_local.m_ptr._7_1_ = false;
    }
    else {
      p_Var1 = local_48->module_local_load;
      ppPVar4 = handle::ptr((handle *)&this_local);
      pvVar5 = (*p_Var1)(*ppPVar4,local_48);
      if (pvVar5 == (void *)0x0) {
        src_local.m_ptr._7_1_ = false;
      }
      else {
        this->value = pvVar5;
        src_local.m_ptr._7_1_ = true;
      }
    }
    return src_local.m_ptr._7_1_;
  }
  return false;
}

Assistant:

PYBIND11_NOINLINE bool try_load_foreign_module_local(handle src) {
        constexpr auto *local_key = PYBIND11_MODULE_LOCAL_ID;
        const auto pytype = type::handle_of(src);
        if (!hasattr(pytype, local_key)) {
            return false;
        }

        type_info *foreign_typeinfo = reinterpret_borrow<capsule>(getattr(pytype, local_key));
        // Only consider this foreign loader if actually foreign and is a loader of the correct cpp
        // type
        if (foreign_typeinfo->module_local_load == &local_load
            || (cpptype && !same_type(*cpptype, *foreign_typeinfo->cpptype))) {
            return false;
        }

        if (auto *result = foreign_typeinfo->module_local_load(src.ptr(), foreign_typeinfo)) {
            value = result;
            return true;
        }
        return false;
    }